

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_Test::
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_Test
          (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).memoryAllocatorStash.
  originalNewAllocator = (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).memoryAllocatorStash.
  originalNewArrayAllocator = (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).dummyReporter =
       (MemoryLeakFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).memoryAllocatorStash.
  originalMallocAllocator = (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).failureReporter =
       (MemoryLeakFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).dummyDetector =
       (DummyMemoryLeakDetector *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).super_Utest._vptr_Utest
       = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).detector =
       (MemoryLeakDetector *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).super_Utest._vptr_Utest
       = (_func_int **)&PTR__Utest_0034f350;
  GlobalMemoryAllocatorStash::GlobalMemoryAllocatorStash
            (&(this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
              memoryAllocatorStash);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).super_Utest._vptr_Utest
       = (_func_int **)&PTR__Utest_0034e2e8;
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, crashOnLeakWithOperatorMalloc)
{
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    crash_on_allocation_number(1);
    char* memory = (char*) cpputest_malloc(10);
    CHECK(cpputestHasCrashed);
    cpputest_free(memory);

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
}